

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnectionchannel.cpp
# Opt level: O2

void __thiscall QHttpNetworkConnectionChannel::allDone(QHttpNetworkConnectionChannel *this)

{
  undefined8 uVar1;
  long *plVar2;
  bool bVar3;
  bool bVar4;
  ConnectionType CVar5;
  SocketState SVar6;
  QSlotObjectBase *pQVar7;
  QHttp2ProtocolHandler *pQVar8;
  long lVar9;
  QHttpNetworkConnection *pQVar10;
  int in_ESI;
  QHttp2ProtocolHandler *obj;
  QObject *pQVar11;
  long in_FS_OFFSET;
  QUrl local_60;
  value_type local_58;
  char *local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(this + 0x38) == 0) {
    local_58.first.super_QHttpNetworkHeader._vptr_QHttpNetworkHeader._0_4_ = 2;
    local_58.second._4_4_ = 0;
    local_58.first.super_QHttpNetworkHeader._vptr_QHttpNetworkHeader._4_4_ = 0;
    local_58.first.d.d.ptr._0_4_ = 0;
    local_58.first.d.d.ptr._4_4_ = 0;
    local_58.second._0_4_ = 0;
    local_40 = "default";
    QMessageLogger::warning
              ((char *)&local_58,
               "QHttpNetworkConnectionChannel::allDone() called without reply. Please report at http://bugreports.qt.io/"
              );
    goto LAB_001f0f93;
  }
  CVar5 = QHttpNetworkConnection::connectionType(*(QHttpNetworkConnection **)(this + 0xf8));
  if (((CVar5 == ConnectionTypeHTTP2) && (this[0x18] == (QHttpNetworkConnectionChannel)0x0)) &&
     (this[0x88] == (QHttpNetworkConnectionChannel)0x0)) {
    bVar3 = Http2::is_protocol_upgraded(*(QHttpNetworkReply **)(this + 0x38));
    if (!bVar3) {
      in_ESI = 0;
      QHttpNetworkConnection::setConnectionType
                (*(QHttpNetworkConnection **)(this + 0xf8),ConnectionTypeHTTP);
      *(undefined4 *)(*(long *)(*(long *)(this + 0xf8) + 8) + 0xa0) =
           *(undefined4 *)(*(long *)(*(long *)(this + 0xf8) + 8) + 0xa4);
      goto LAB_001f0d4a;
    }
    this[0x88] = (QHttpNetworkConnectionChannel)0x1;
    QAbstractProtocolHandler::setReply
              (*(QAbstractProtocolHandler **)(this + 0x78),(QHttpNetworkReply *)0x0);
    uVar1 = *(undefined8 *)(this + 0x78);
    *(undefined8 *)(this + 0x78) = 0;
    local_58.first.super_QHttpNetworkHeader._vptr_QHttpNetworkHeader._0_4_ = 0;
    local_58.first.super_QHttpNetworkHeader._vptr_QHttpNetworkHeader._4_4_ = 0;
    local_58.first.d.d.ptr._0_4_ = 0;
    local_58.first.d.d.ptr._4_4_ = 0;
    local_58.second._0_4_ = 0x2c9020;
    local_58.second._4_4_ = 0;
    pQVar7 = (QSlotObjectBase *)operator_new(0x18);
    (pQVar7->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i = 1;
    pQVar7->m_impl =
         QtPrivate::
         QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/network/access/qhttpnetworkconnectionchannel.cpp:486:45),_QtPrivate::List<>,_void>
         ::impl;
    *(undefined8 *)(pQVar7 + 1) = uVar1;
    QMetaObject::invokeMethodImpl
              ((QObject *)this,pQVar7,QueuedConnection,1,(void **)&local_58,
               (char **)&local_58.first.d,(QMetaTypeInterface **)&local_58.second);
    QHttpNetworkConnection::fillHttp2Queue(*(QHttpNetworkConnection **)(this + 0xf8));
    pQVar8 = (QHttp2ProtocolHandler *)operator_new(0x58);
    QHttp2ProtocolHandler::QHttp2ProtocolHandler(pQVar8,(QHttpNetworkConnectionChannel *)this);
    pQVar8 = pQVar8 + 0x10;
    plVar2 = *(long **)(this + 0x78);
    *(QHttp2ProtocolHandler **)(this + 0x78) = pQVar8;
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
      pQVar8 = *(QHttp2ProtocolHandler **)(this + 0x78);
    }
    obj = pQVar8 + -0x10;
    if (pQVar8 == (QHttp2ProtocolHandler *)0x0) {
      obj = (QHttp2ProtocolHandler *)0x0;
    }
    QMetaObject::invokeMethod<>((QObject *)obj,"_q_receiveReply",QueuedConnection);
  }
  else {
LAB_001f0d4a:
    bVar3 = QHttpNetworkReplyPrivate::shouldEmitSignals
                      (*(QHttpNetworkReplyPrivate **)(*(long *)(this + 0x38) + 8));
    bVar4 = QHttpNetworkReplyPrivate::isConnectionCloseEnabled
                      (*(QHttpNetworkReplyPrivate **)(*(long *)(this + 0x38) + 8));
    detectPipeliningSupport(this);
    handleStatus(this);
    if (*(QObject **)(this + 0x38) != (QObject *)0x0 && bVar3) {
      in_ESI = 0x250610;
      QMetaObject::invokeMethod<>(*(QObject **)(this + 0x38),"finished",QueuedConnection);
    }
    *(undefined4 *)(this + 0x5c) = 3;
    if (*(int *)(this + 0x20) != 0x10) {
      *(undefined4 *)(this + 0x20) = 0;
    }
    if (this[0x50] == (QHttpNetworkConnectionChannel)0x0) {
      QUrl::QUrl(&local_60);
      QHttpNetworkRequest::QHttpNetworkRequest(&local_58.first,&local_60,Get,NormalPriority);
      QHttpNetworkRequest::operator=((QHttpNetworkRequest *)(this + 0x28),&local_58.first);
      QHttpNetworkRequest::~QHttpNetworkRequest(&local_58.first);
      QUrl::~QUrl(&local_60);
      *(undefined8 *)(this + 0x38) = 0;
      in_ESI = 0;
      QAbstractProtocolHandler::setReply
                (*(QAbstractProtocolHandler **)(this + 0x78),(QHttpNetworkReply *)0x0);
    }
    if (*(long *)(this + 200) != 0) {
      if (!bVar4 && this[0x50] == (QHttpNetworkConnectionChannel)0x0) {
        SVar6 = QSocketAbstraction::socketState(*(QIODevice **)(this + 0x10));
        if (SVar6 == ConnectedState) {
          local_58.second._0_4_ = 0xaaaaaaaa;
          local_58.second._4_4_ = 0xaaaaaaaa;
          local_58.first.super_QHttpNetworkHeader._vptr_QHttpNetworkHeader._0_4_ = 0xaaaaaaaa;
          local_58.first.super_QHttpNetworkHeader._vptr_QHttpNetworkHeader._4_4_ = 0xaaaaaaaa;
          local_58.first.d.d.ptr._0_4_ = 0xaaaaaaaa;
          local_58.first.d.d.ptr._4_4_ = 0xaaaaaaaa;
          QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::takeFirst
                    (&local_58,
                     (QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)(this + 0xb8));
          QHttpNetworkRequest::operator=((QHttpNetworkRequest *)(this + 0x28),&local_58.first);
          *(QHttpNetworkReply **)(this + 0x38) =
               (QHttpNetworkReply *)CONCAT44(local_58.second._4_4_,local_58.second._0_4_);
          QAbstractProtocolHandler::setReply
                    (*(QAbstractProtocolHandler **)(this + 0x78),
                     (QHttpNetworkReply *)CONCAT44(local_58.second._4_4_,local_58.second._0_4_));
          *(undefined4 *)(this + 0x20) = 8;
          *(undefined8 *)(this + 0x40) = 0;
          *(undefined8 *)(this + 0x48) = 0;
          this[0x50] = (QHttpNetworkConnectionChannel)0x0;
          QHttpNetworkConnectionPrivate::fillPipeline
                    (*(QHttpNetworkConnectionPrivate **)(*(long *)(this + 0xf8) + 8),
                     *(QIODevice **)(this + 0x10));
          QHttpNetworkRequest::~QHttpNetworkRequest(&local_58.first);
          goto LAB_001f0f93;
        }
      }
      requeueCurrentlyPipelinedRequests(this);
      close(this,in_ESI);
      goto LAB_001f0f93;
    }
    lVar9 = (**(code **)(**(long **)(this + 0x10) + 0xa0))();
    if (lVar9 < 1) {
      if (*(long *)(this + 200) != 0) goto LAB_001f0f93;
      if (bVar4) {
        SVar6 = QSocketAbstraction::socketState(*(QIODevice **)(this + 0x10));
        if (SVar6 != UnconnectedState) {
          close(this,in_ESI);
        }
      }
      if ((*(long *)(this + 0xf0) == 0) || (*(int *)(*(long *)(this + 0xf0) + 4) == 0)) {
        pQVar11 = (QObject *)0x0;
      }
      else {
        pQVar11 = *(QObject **)(this + 0xf8);
      }
      pQVar10 = QtPrivate::qobject_cast_helper<QHttpNetworkConnection*,QObject>(pQVar11);
      if (pQVar10 == (QHttpNetworkConnection *)0x0) goto LAB_001f0f93;
    }
    else {
      close(this,in_ESI);
    }
  }
  if ((*(long *)(this + 0xf0) == 0) || (*(int *)(*(long *)(this + 0xf0) + 4) == 0)) {
    pQVar11 = (QObject *)0x0;
  }
  else {
    pQVar11 = *(QObject **)(this + 0xf8);
  }
  QMetaObject::invokeMethod<>(pQVar11,"_q_startNextRequest",QueuedConnection);
LAB_001f0f93:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpNetworkConnectionChannel::allDone()
{
    Q_ASSERT(reply);

    if (!reply) {
        qWarning("QHttpNetworkConnectionChannel::allDone() called without reply. Please report at http://bugreports.qt.io/");
        return;
    }

    // For clear text HTTP/2 we tried to upgrade from HTTP/1.1 to HTTP/2; for
    // ConnectionTypeHTTP2Direct we can never be here in case of failure
    // (after an attempt to read HTTP/1.1 as HTTP/2 frames) or we have a normal
    // HTTP/2 response and thus can skip this test:
    if (connection->connectionType() == QHttpNetworkConnection::ConnectionTypeHTTP2
        && !ssl && !switchedToHttp2) {
        if (Http2::is_protocol_upgraded(*reply)) {
            switchedToHttp2 = true;
            protocolHandler->setReply(nullptr);

            // As allDone() gets called from the protocol handler, it's not yet
            // safe to delete it. There is no 'deleteLater', since
            // QAbstractProtocolHandler is not a QObject. Instead delete it in
            // a queued emission.

            QMetaObject::invokeMethod(this, [oldHandler = std::move(protocolHandler)]() mutable {
                oldHandler.reset();
            }, Qt::QueuedConnection);

            connection->fillHttp2Queue();
            protocolHandler.reset(new QHttp2ProtocolHandler(this));
            QHttp2ProtocolHandler *h2c = static_cast<QHttp2ProtocolHandler *>(protocolHandler.get());
            QMetaObject::invokeMethod(h2c, "_q_receiveReply", Qt::QueuedConnection);
            QMetaObject::invokeMethod(connection, "_q_startNextRequest", Qt::QueuedConnection);
            return;
        } else {
            // Ok, whatever happened, we do not try HTTP/2 anymore ...
            connection->setConnectionType(QHttpNetworkConnection::ConnectionTypeHTTP);
            connection->d_func()->activeChannelCount = connection->d_func()->channelCount;
        }
    }

    // while handling 401 & 407, we might reset the status code, so save this.
    bool emitFinished = reply->d_func()->shouldEmitSignals();
    bool connectionCloseEnabled = reply->d_func()->isConnectionCloseEnabled();
    detectPipeliningSupport();

    handleStatus();
    // handleStatus() might have removed the reply because it already called connection->emitReplyError()

    // queue the finished signal, this is required since we might send new requests from
    // slot connected to it. The socket will not fire readyRead signal, if we are already
    // in the slot connected to readyRead
    if (reply && emitFinished)
        QMetaObject::invokeMethod(reply, "finished", Qt::QueuedConnection);


    // reset the reconnection attempts after we receive a complete reply.
    // in case of failures, each channel will attempt two reconnects before emitting error.
    reconnectAttempts = reconnectAttemptsDefault;

    // now the channel can be seen as free/idle again, all signal emissions for the reply have been done
    if (state != QHttpNetworkConnectionChannel::ClosingState)
        state = QHttpNetworkConnectionChannel::IdleState;

    // if it does not need to be sent again we can set it to 0
    // the previous code did not do that and we had problems with accidental re-sending of a
    // finished request.
    // Note that this may trigger a segfault at some other point. But then we can fix the underlying
    // problem.
    if (!resendCurrent) {
        request = QHttpNetworkRequest();
        reply = nullptr;
        protocolHandler->setReply(nullptr);
    }

    // move next from pipeline to current request
    if (!alreadyPipelinedRequests.isEmpty()) {
        if (resendCurrent || connectionCloseEnabled || QSocketAbstraction::socketState(socket) != QAbstractSocket::ConnectedState) {
            // move the pipelined ones back to the main queue
            requeueCurrentlyPipelinedRequests();
            close();
        } else {
            // there were requests pipelined in and we can continue
            HttpMessagePair messagePair = alreadyPipelinedRequests.takeFirst();

            request = messagePair.first;
            reply = messagePair.second;
            protocolHandler->setReply(messagePair.second);
            state = QHttpNetworkConnectionChannel::ReadingState;
            resendCurrent = false;

            written = 0; // message body, excluding the header, irrelevant here
            bytesTotal = 0; // message body total, excluding the header, irrelevant here

            // pipeline even more
            connection->d_func()->fillPipeline(socket);

            // continue reading
            //_q_receiveReply();
            // this was wrong, allDone gets called from that function anyway.
        }
    } else if (alreadyPipelinedRequests.isEmpty() && socket->bytesAvailable() > 0) {
        // this is weird. we had nothing pipelined but still bytes available. better close it.
        close();

        QMetaObject::invokeMethod(connection, "_q_startNextRequest", Qt::QueuedConnection);
    } else if (alreadyPipelinedRequests.isEmpty()) {
        if (connectionCloseEnabled)
            if (QSocketAbstraction::socketState(socket) != QAbstractSocket::UnconnectedState)
                close();
        if (qobject_cast<QHttpNetworkConnection*>(connection))
            QMetaObject::invokeMethod(connection, "_q_startNextRequest", Qt::QueuedConnection);
    }
}